

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IntegerVectorExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntegerVectorExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Token base;
  Token size;
  IntegerVectorExpressionSyntax *pIVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Token *in_RSI;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pIVar1 = (IntegerVectorExpressionSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  size.info = (Info *)*in_RDX;
  size._0_8_ = (IntegerVectorExpressionSyntax *)in_RCX[1];
  base.info = (Info *)*in_RCX;
  base._0_8_ = pIVar1;
  slang::syntax::IntegerVectorExpressionSyntax::IntegerVectorExpressionSyntax
            ((IntegerVectorExpressionSyntax *)in_RCX[1],size,base,*in_RSI);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }